

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightParameters.hpp
# Opt level: O0

void __thiscall OpenMD::Perturbations::LightParameters::~LightParameters(LightParameters *this)

{
  LightParameters *in_RDI;
  
  ~LightParameters(in_RDI);
  operator_delete(in_RDI,0x220);
  return;
}

Assistant:

virtual ~LightParameters() = default;